

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsTagCompare(FmsTag lhs,FmsTag rhs)

{
  FmsIntType itype;
  FmsComponent lhs_00;
  uint uVar1;
  int iVar2;
  FmsInt FVar3;
  uint uVar4;
  
  if (lhs != rhs) {
    if (lhs == (FmsTag)0x0) {
      uVar4 = 0xffffffff;
    }
    else if (rhs == (FmsTag)0x0) {
      uVar4 = 0xfffffffe;
    }
    else {
      if (lhs->name == (char *)0x0) {
        uVar4 = 2;
      }
      else if (rhs->name == (char *)0x0) {
        uVar4 = 3;
      }
      else {
        iVar2 = strcmp(lhs->name,rhs->name);
        uVar4 = (uint)(iVar2 != 0);
      }
      itype = lhs->tag_type;
      uVar1 = uVar4 + 10;
      if (itype == rhs->tag_type) {
        uVar1 = uVar4;
      }
      uVar4 = uVar1 + 0x14;
      if (lhs->num_tag_descriptions == rhs->num_tag_descriptions) {
        uVar4 = uVar1;
      }
      if (uVar4 == 0) {
        lhs_00 = lhs->comp;
        iVar2 = FmsComponentCompare(lhs_00,rhs->comp);
        if (iVar2 == 0) {
          FVar3 = CompareIntData(itype,lhs_00->num_main_entities,lhs->tags,rhs->tags);
          uVar4 = 1000;
          if (FVar3 == 0) {
            uVar4 = 0;
          }
        }
        else {
          uVar4 = 100;
        }
      }
    }
    return uVar4;
  }
  return 0;
}

Assistant:

int FmsTagCompare(FmsTag lhs, FmsTag rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;

  if(lhs->tag_type != rhs->tag_type)
    diff += 10;

  if(lhs->num_tag_descriptions != rhs->num_tag_descriptions)
    diff += 20;

  if(diff == 0) {
    if(FmsComponentCompare(lhs->comp, rhs->comp))
      diff += 100;
  }

  if(diff == 0) {
    FmsInt ne = lhs->comp->num_main_entities;
    if(CompareIntData(lhs->tag_type, ne, lhs->tags, rhs->tags))
      diff += 1000;
  }

  return diff;
}